

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  ushort uVar1;
  char *pcVar2;
  uint *__ptr;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  Wlc_Obj_t *pWVar16;
  char *pArray;
  size_t __size;
  int iVar17;
  int *piVar18;
  long lVar19;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar3 = malloc(1000);
  *(void **)(__ptr + 2) = pvVar3;
  pVVar4 = p->vInits;
  if (0 < pVVar4->nSize) {
    lVar19 = 0;
    do {
      iVar17 = pVVar4->pArray[lVar19];
      if ((long)iVar17 < 0) {
        iVar17 = -iVar17;
        lVar15 = (long)(int)__ptr[1];
        uVar11 = *__ptr;
        pvVar3 = *(void **)(__ptr + 2);
        if (iVar17 < 2) {
          iVar17 = 1;
        }
        do {
          if ((uint)lVar15 == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (pvVar3 == (void *)0x0) {
                pvVar3 = malloc(0x10);
              }
              else {
                pvVar3 = realloc(pvVar3,0x10);
              }
              uVar11 = 0x10;
            }
            else {
              uVar13 = uVar11 * 2;
              if (SBORROW4(uVar11,uVar13) != 0 < (int)uVar11) {
                uVar11 = uVar13;
                if (pvVar3 == (void *)0x0) {
                  pvVar3 = malloc((ulong)uVar13);
                }
                else {
                  pvVar3 = realloc(pvVar3,(ulong)uVar13);
                }
              }
            }
          }
          *(undefined1 *)((long)pvVar3 + lVar15) = 0x30;
          lVar15 = lVar15 + 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        __ptr[1] = (uint)lVar15;
        *__ptr = uVar11;
        *(void **)(__ptr + 2) = pvVar3;
      }
      else {
        if ((iVar17 == 0) || (p->nObjsAlloc <= iVar17)) {
LAB_00373a44:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar16 = p->pObjs + iVar17;
        uVar13 = pWVar16->End - pWVar16->Beg;
        uVar11 = -uVar13;
        if (0 < (int)uVar13) {
          uVar11 = uVar13;
        }
        while( true ) {
          uVar1 = *(ushort *)pWVar16;
          if ((uVar1 & 0x3f) != 7) break;
          paVar12 = &pWVar16->field_10;
          if (((uVar1 & 0x2f) == 6) || (2 < pWVar16->nFanins)) {
            paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
          }
          iVar17 = paVar12->Fanins[0];
          if (((long)iVar17 < 1) || (p->nObjsAlloc <= iVar17)) goto LAB_00373a44;
          pWVar16 = p->pObjs + iVar17;
        }
        if (((uVar1 & 0x3f) == 6) && ((uVar1 >> 0xb & 1) == 0)) {
          piVar18 = (pWVar16->field_10).pFanins[0];
        }
        else {
          piVar18 = (int *)0x0;
        }
        uVar6 = __ptr[1];
        lVar15 = (long)(int)uVar6;
        uVar5 = *__ptr;
        pvVar3 = *(void **)(__ptr + 2);
        uVar8 = 0;
        do {
          uVar7 = uVar8;
          if (piVar18 == (int *)0x0) {
            bVar9 = 0x78;
          }
          else {
            bVar9 = ((uint)piVar18[uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0 | 0x30;
          }
          if (uVar6 + uVar7 == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (pvVar3 == (void *)0x0) {
                pvVar3 = malloc(0x10);
              }
              else {
                pvVar3 = realloc(pvVar3,0x10);
              }
              uVar5 = 0x10;
            }
            else {
              uVar8 = uVar5 * 2;
              if (SBORROW4(uVar5,uVar8) != 0 < (int)uVar5) {
                uVar5 = uVar8;
                if (pvVar3 == (void *)0x0) {
                  pvVar3 = malloc((ulong)uVar8);
                }
                else {
                  pvVar3 = realloc(pvVar3,(ulong)uVar8);
                }
              }
            }
          }
          *(byte *)((long)pvVar3 + lVar15) = bVar9;
          lVar15 = lVar15 + 1;
          uVar8 = uVar7 + 1;
          iVar10 = pWVar16->End - pWVar16->Beg;
          iVar17 = -iVar10;
          if (0 < iVar10) {
            iVar17 = iVar10;
          }
          uVar14 = iVar17 + 1U;
          if ((int)(uVar11 + 1) < (int)(iVar17 + 1U)) {
            uVar14 = uVar11 + 1;
          }
        } while (uVar8 < uVar14);
        __ptr[1] = uVar6 + uVar8;
        *__ptr = uVar5;
        *(void **)(__ptr + 2) = pvVar3;
        if (uVar7 < uVar11) {
          lVar15 = (long)(int)__ptr[1];
          uVar6 = *__ptr;
          pvVar3 = *(void **)(__ptr + 2);
          uVar5 = -uVar13;
          if (0 < (int)uVar13) {
            uVar5 = uVar13;
          }
          iVar17 = uVar5 - uVar7;
          do {
            if ((uint)lVar15 == uVar6) {
              if ((int)uVar6 < 0x10) {
                if (pvVar3 == (void *)0x0) {
                  pvVar3 = malloc(0x10);
                }
                else {
                  pvVar3 = realloc(pvVar3,0x10);
                }
                uVar6 = 0x10;
              }
              else {
                uVar13 = uVar6 * 2;
                if (SBORROW4(uVar6,uVar13) != 0 < (int)uVar6) {
                  uVar6 = uVar13;
                  if (pvVar3 == (void *)0x0) {
                    pvVar3 = malloc((ulong)uVar13);
                  }
                  else {
                    pvVar3 = realloc(pvVar3,(ulong)uVar13);
                  }
                }
              }
            }
            *(undefined1 *)((long)pvVar3 + lVar15) = 0x30;
            lVar15 = lVar15 + 1;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          __ptr[1] = (uint)lVar15;
          *__ptr = uVar6;
          *(void **)(__ptr + 2) = pvVar3;
        }
        if ((piVar18 == (int *)0x0) && ((*(uint *)pWVar16 >> 0xb & 1) == 0)) {
          if (((ushort)*(uint *)pWVar16 & 0x3d) != 1) {
            __assert_fail("Wlc_ObjIsCi(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
          }
          uVar11 = (pWVar16->field_10).Fanins[1];
        }
        else {
          uVar11 = ~uVar11;
        }
        if (p->vInits->nSize <= lVar19) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vInits->pArray[lVar19] = uVar11;
      }
      lVar19 = lVar19 + 1;
      pVVar4 = p->vInits;
    } while (lVar19 < pVVar4->nSize);
  }
  uVar11 = __ptr[1];
  uVar13 = *__ptr;
  if (uVar11 == uVar13) {
    if ((int)uVar13 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar3 = malloc(0x10);
      }
      else {
        pvVar3 = realloc(*(void **)(__ptr + 2),0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar13 * 2;
      if ((int)__size <= (int)uVar13) goto LAB_003739ee;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar3 = malloc(__size);
      }
      else {
        pvVar3 = realloc(*(void **)(__ptr + 2),__size);
      }
    }
    *(void **)(__ptr + 2) = pvVar3;
    *__ptr = (uint)__size;
  }
LAB_003739ee:
  pcVar2 = *(char **)(__ptr + 2);
  __ptr[1] = uVar11 + 1;
  pcVar2[(int)uVar11] = '\0';
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return pcVar2;
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = (pObj->Type == WLC_OBJ_CONST && !pObj->fXConst) ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'x') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, (pInits || pObj->fXConst) ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}